

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

type notch::core::internal::scale<float*>
               (float alpha,float *x_begin,float *x_end,float *y_begin,float *y_end)

{
  ulong uVar1;
  ulong uVar2;
  ostream *poVar3;
  invalid_argument *this;
  float *y_i;
  ulong uStack_1f8;
  float x_i;
  OMP_size_t i;
  string local_1e8 [48];
  ostringstream local_1b8 [8];
  ostringstream what;
  size_t y_size;
  size_t x_size;
  float *y_end_local;
  float *y_begin_local;
  float *x_end_local;
  float *x_begin_local;
  float alpha_local;
  
  uVar1 = ::std::distance<float*>(x_begin,x_end);
  uVar2 = ::std::distance<float*>(y_begin,y_end);
  if (uVar1 != uVar2) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar3 = ::std::operator<<((ostream *)local_1b8,"stl_scale: incompatible shapes:\n");
    poVar3 = ::std::operator<<(poVar3," vector X size = ");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,uVar1);
    poVar3 = ::std::operator<<(poVar3," vector Y size = ");
    ::std::ostream::operator<<(poVar3,uVar2);
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::ostringstream::str();
    ::std::invalid_argument::invalid_argument(this,local_1e8);
    __cxa_throw(this,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument);
  }
  for (uStack_1f8 = 0; uStack_1f8 < uVar1; uStack_1f8 = uStack_1f8 + 1) {
    y_begin[uStack_1f8] = alpha * x_begin[uStack_1f8];
  }
  return;
}

Assistant:

typename std::enable_if<std::is_pointer<Vector_Iter>::value, void>::type
INTERNAL_NOBLAS(scale)(
      float alpha,
      Vector_Iter x_begin, Vector_Iter x_end,
      Vector_Iter y_begin, Vector_Iter y_end) {
    size_t x_size = std::distance(x_begin, x_end);
    size_t y_size = std::distance(y_begin, y_end);
    if (x_size != y_size) {
        std::ostringstream what;
        what << "stl_scale: incompatible shapes:\n"
            << " vector X size = " << x_size
            << " vector Y size = " << y_size;
        throw std::invalid_argument(what.str());
    }
#ifdef NOTCH_USE_OPENMP
#pragma omp parallel for shared(x_begin, y_begin, x_size, alpha)
#endif
    for (OMP_size_t i = 0; i < x_size; ++i) {
        float x_i = *(x_begin + i);
        float &y_i = *(y_begin + i);
        y_i = alpha * x_i;
    }
}